

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.cpp
# Opt level: O3

void luaV_execute(lua_State *L,int nexeccalls)

{
  int *piVar1;
  undefined8 uVar2;
  byte bVar3;
  long lVar4;
  GCObject *pGVar5;
  bool bVar6;
  GCObject *pGVar7;
  UpVal *pUVar8;
  TValue *pTVar9;
  Value *pVVar10;
  TValue *pTVar11;
  uint *obj;
  Value *val;
  StkId pTVar12;
  long lVar13;
  lu_byte *plVar14;
  int line;
  ulong uVar15;
  TValue *obj_00;
  uint uVar16;
  long *plVar17;
  int iVar18;
  char *pcVar19;
  TMS op;
  StkId level;
  TValue *o1;
  Value *pVVar20;
  Table *pTVar21;
  uint uVar22;
  GCObject *unaff_R14;
  uint uVar23;
  GCObject *pGVar24;
  double dVar25;
  lua_Number lVar26;
  TValue g;
  TValue TStack_c8;
  TValue TStack_b8;
  GCObject *pGStack_a8;
  Value *pVStack_a0;
  Value *pVStack_98;
  GCObject *pGStack_90;
  ulong uStack_88;
  code *pcStack_80;
  GCObject *local_78;
  StkId local_70;
  GCObject *local_68;
  long local_60;
  int local_54;
  double local_50;
  double local_48;
  Value local_40;
  undefined4 local_38;
  
  local_68 = (GCObject *)L;
  local_54 = nexeccalls;
LAB_00117068:
  level = L->base;
  local_60 = **(long **)&(((GCObject *)L->ci)->gch).tt;
  local_70 = *(StkId *)(*(long *)(local_60 + 0x20) + 0x10);
  pGVar24 = (GCObject *)((Proto *)L)->locvars;
LAB_0011708d:
  do {
    pGVar7 = pGVar24;
    local_78 = (GCObject *)((long)&(pGVar7->gch).next + 4);
    uVar23 = *(uint *)&(pGVar7->gch).next;
    bVar3 = L->hookmask;
    if ((bVar3 & 0xc) != 0) {
      piVar1 = &L->hookcount;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        unaff_R14 = ((Table *)L)->gclist;
        ((Proto *)L)->locvars = (LocVar *)local_78;
        if ((bVar3 & 8) != 0) {
          L->hookcount = (int)*(size_t *)&L->basehookcount;
          pcStack_80 = (code *)0x1170e9;
          luaD_callhook(L,3,-1);
        }
      }
      else {
        if ((bVar3 & 4) == 0) goto LAB_00117174;
        unaff_R14 = ((Table *)L)->gclist;
        ((Proto *)L)->locvars = (LocVar *)local_78;
      }
      if ((bVar3 & 4) != 0) {
        lVar13 = *(long *)(**(long **)&(((GCObject *)L->ci)->gch).tt + 0x20);
        lVar4 = *(long *)(lVar13 + 0x18);
        lVar13 = *(long *)(lVar13 + 0x28);
        iVar18 = (int)((ulong)((long)local_78 - lVar4) >> 2) + -1;
        if (lVar13 == 0) {
          line = 0;
          if ((iVar18 == 0) || (local_78 <= unaff_R14)) goto LAB_00117155;
        }
        else {
          line = *(int *)(lVar13 + (long)iVar18 * 4);
          if ((iVar18 == 0) ||
             ((local_78 <= unaff_R14 ||
              (unaff_R14 = (GCObject *)
                           (((long)unaff_R14 - lVar4) * 0x40000000 + -0x100000000 >> 0x20),
              line != *(int *)(lVar13 + (long)unaff_R14 * 4))))) {
LAB_00117155:
            pcStack_80 = (code *)0x117162;
            luaD_callhook(L,2,line);
          }
        }
      }
      if (((Table *)L)->flags == '\x01') {
        ((Proto *)L)->locvars = (LocVar *)pGVar7;
        return;
      }
      level = L->base;
    }
LAB_00117174:
    lVar13 = local_60;
    pGVar24 = local_78;
  } while (0x25 < (uVar23 & 0x3f));
  uVar16 = uVar23 >> 6 & 0xff;
  pVVar20 = (Value *)((long)&level->value + (ulong)(uVar16 << 4));
  obj = &switchD_001171a4::switchdataD_0011f18c;
  switch(uVar23 & 0x3f) {
  case 0:
    uVar15 = (ulong)(uVar23 >> 0x13 & 0xfffffff0);
    *pVVar20 = *(Value *)((long)&level->value + uVar15);
    pVVar20[1].b = *(int *)((long)&level->tt + uVar15);
    goto LAB_0011708d;
  case 1:
    uVar15 = (ulong)(uVar23 >> 10 & 0xfffffff0);
    *pVVar20 = *(Value *)((long)&local_70->value + uVar15);
    pVVar20[1].b = *(int *)((long)&local_70->tt + uVar15);
    goto LAB_0011708d;
  case 2:
    pVVar20->b = uVar23 >> 0x17;
    pVVar20[1].b = 1;
    if ((uVar23 & 0x7fc000) != 0) {
      pGVar24 = (GCObject *)&(pGVar7->gch).tt;
    }
    goto LAB_0011708d;
  case 3:
    pVVar10 = (Value *)((long)&level->value + (ulong)(uVar23 >> 0x13 & 0xfffffff0));
    do {
      pVVar10[1].b = 0;
      pVVar10 = pVVar10 + -2;
    } while (pVVar20 <= pVVar10);
    goto LAB_0011708d;
  case 4:
    pVVar10 = *(Value **)(*(long *)(local_60 + (ulong)(uVar23 >> 0x17) * 8 + 0x28) + 0x10);
    *pVVar20 = *pVVar10;
    pVVar20[1].b = pVVar10[1].b;
    goto LAB_0011708d;
  case 5:
    pTVar9 = (TValue *)((long)&local_70->value + (ulong)(uVar23 >> 10 & 0xfffffff0));
    local_40 = *(Value *)(local_60 + 0x18);
    pVVar10 = &local_40;
    local_38 = 5;
    ((Proto *)L)->locvars = (LocVar *)local_78;
    goto LAB_001179a5;
  case 6:
    uVar15 = (ulong)(uVar23 >> 0x13 & 0xfffffff0);
    goto LAB_00117988;
  case 7:
    local_40 = *(Value *)(local_60 + 0x18);
    pVVar10 = &local_40;
    local_38 = 5;
    ((Proto *)L)->locvars = (LocVar *)local_78;
    pTVar9 = (TValue *)((long)&local_70->value + (ulong)(uVar23 >> 10 & 0xfffffff0));
    val = pVVar20;
    goto LAB_00117637;
  case 8:
    pGVar7 = *(GCObject **)(local_60 + (ulong)(uVar23 >> 0x17) * 8 + 0x28);
    pTVar9 = (pGVar7->p).k;
    pTVar9->value = *pVVar20;
    iVar18 = pVVar20[1].b;
    pTVar9->tt = iVar18;
    if (((3 < iVar18) && (((pVVar20->gc->gch).marked & 3) != 0)) &&
       (((pGVar7->gch).marked & 4) != 0)) {
      pcStack_80 = (code *)0x117a9f;
      luaC_barrierf(L,pGVar7,pVVar20->gc);
      L = (lua_State *)local_68;
      pGVar24 = local_78;
    }
    goto LAB_0011708d;
  case 9:
    pTVar9 = (TValue *)((long)&level->value + (ulong)(uVar23 >> 0x13 & 0xfffffff0));
    if ((int)uVar23 < 0) {
      pTVar9 = (TValue *)((long)&local_70->value + (ulong)(uVar23 >> 0x13 & 0xff0));
    }
    if ((uVar23 >> 0x16 & 1) != 0) {
      level = local_70;
    }
    ((Proto *)L)->locvars = (LocVar *)local_78;
    val = (Value *)((long)&level->value + (ulong)(uVar23 >> 10 & 0xff0));
    pVVar10 = pVVar20;
LAB_00117637:
    pcStack_80 = (code *)0x11763c;
    luaV_settable(L,(TValue *)pVVar10,pTVar9,(StkId)val);
    pGVar24 = local_78;
    goto LAB_00117dcc;
  case 10:
    pcStack_80 = (code *)0x117a06;
    uVar16 = luaO_fb2int(uVar23 >> 0x17);
    unaff_R14 = (GCObject *)(ulong)uVar16;
    pcStack_80 = (code *)0x117a11;
    iVar18 = luaO_fb2int(uVar23 >> 0xe & 0x1ff);
    pcStack_80 = (code *)0x117a1e;
    pGVar24 = (GCObject *)luaH_new(L,uVar16,iVar18);
    pVVar20->gc = pGVar24;
    pVVar20[1].b = 5;
    ((Proto *)L)->locvars = (LocVar *)local_78;
    pGVar24 = local_78;
    if (L->l_G->GCthreshold <= L->l_G->totalbytes) {
      pcStack_80 = (code *)0x117a4d;
      luaC_step(L);
      pGVar24 = local_78;
    }
    goto LAB_00117dcc;
  case 0xb:
    uVar15 = (ulong)(uVar23 >> 0x13 & 0xfffffff0);
    pVVar20[2] = *(Value *)((long)&level->value + uVar15);
    pVVar20[3].b = *(int *)((long)&level->tt + uVar15);
LAB_00117988:
    pVVar10 = (Value *)((long)&level->value + uVar15);
    if ((uVar23 >> 0x16 & 1) != 0) {
      level = local_70;
    }
    ((Proto *)L)->locvars = (LocVar *)local_78;
    pTVar9 = (TValue *)((long)&level->value + (ulong)(uVar23 >> 10 & 0xff0));
LAB_001179a5:
    pcStack_80 = (code *)0x1179b3;
    luaV_gettable(L,(TValue *)pVVar10,pTVar9,(StkId)pVVar20);
    pGVar24 = local_78;
    goto LAB_00117dcc;
  case 0xc:
    pTVar11 = (TValue *)((long)&level->value + (ulong)(uVar23 >> 0x13 & 0xfffffff0));
    if ((int)uVar23 < 0) {
      pTVar11 = (TValue *)((long)&local_70->value + (ulong)(uVar23 >> 0x13 & 0xff0));
    }
    pTVar12 = local_70;
    if ((uVar23 >> 0x16 & 1) == 0) {
      pTVar12 = level;
    }
    pTVar9 = (TValue *)((long)&pTVar12->value + (ulong)(uVar23 >> 10 & 0xff0));
    if ((pTVar11->tt == 3) && (pTVar9->tt == 3)) {
      lVar26 = (pTVar11->value).n + (pTVar9->value).n;
LAB_00117968:
      pVVar20->n = lVar26;
      pVVar20[1].b = 3;
      pGVar24 = local_78;
      goto LAB_0011708d;
    }
    ((Proto *)L)->locvars = (LocVar *)local_78;
    op = TM_ADD;
    break;
  case 0xd:
    pTVar11 = (TValue *)((long)&level->value + (ulong)(uVar23 >> 0x13 & 0xfffffff0));
    if ((int)uVar23 < 0) {
      pTVar11 = (TValue *)((long)&local_70->value + (ulong)(uVar23 >> 0x13 & 0xff0));
    }
    pTVar12 = local_70;
    if ((uVar23 >> 0x16 & 1) == 0) {
      pTVar12 = level;
    }
    pTVar9 = (TValue *)((long)&pTVar12->value + (ulong)(uVar23 >> 10 & 0xff0));
    if ((pTVar11->tt == 3) && (pTVar9->tt == 3)) {
      lVar26 = (pTVar11->value).n - (pTVar9->value).n;
      goto LAB_00117968;
    }
    ((Proto *)L)->locvars = (LocVar *)local_78;
    op = TM_SUB;
    break;
  case 0xe:
    pTVar11 = (TValue *)((long)&level->value + (ulong)(uVar23 >> 0x13 & 0xfffffff0));
    if ((int)uVar23 < 0) {
      pTVar11 = (TValue *)((long)&local_70->value + (ulong)(uVar23 >> 0x13 & 0xff0));
    }
    pTVar12 = local_70;
    if ((uVar23 >> 0x16 & 1) == 0) {
      pTVar12 = level;
    }
    pTVar9 = (TValue *)((long)&pTVar12->value + (ulong)(uVar23 >> 10 & 0xff0));
    if ((pTVar11->tt == 3) && (pTVar9->tt == 3)) {
      lVar26 = (pTVar11->value).n * (pTVar9->value).n;
      goto LAB_00117968;
    }
    ((Proto *)L)->locvars = (LocVar *)local_78;
    op = TM_MUL;
    break;
  case 0xf:
    pTVar11 = (TValue *)((long)&level->value + (ulong)(uVar23 >> 0x13 & 0xfffffff0));
    if ((int)uVar23 < 0) {
      pTVar11 = (TValue *)((long)&local_70->value + (ulong)(uVar23 >> 0x13 & 0xff0));
    }
    pTVar12 = local_70;
    if ((uVar23 >> 0x16 & 1) == 0) {
      pTVar12 = level;
    }
    pTVar9 = (TValue *)((long)&pTVar12->value + (ulong)(uVar23 >> 10 & 0xff0));
    if ((pTVar11->tt == 3) && (pTVar9->tt == 3)) {
      lVar26 = (pTVar11->value).n / (pTVar9->value).n;
      goto LAB_00117968;
    }
    ((Proto *)L)->locvars = (LocVar *)local_78;
    op = TM_DIV;
    break;
  case 0x10:
    pTVar11 = (TValue *)((long)&level->value + (ulong)(uVar23 >> 0x13 & 0xfffffff0));
    if ((int)uVar23 < 0) {
      pTVar11 = (TValue *)((long)&local_70->value + (ulong)(uVar23 >> 0x13 & 0xff0));
    }
    pTVar12 = local_70;
    if ((uVar23 >> 0x16 & 1) == 0) {
      pTVar12 = level;
    }
    pTVar9 = (TValue *)((long)&pTVar12->value + (ulong)(uVar23 >> 10 & 0xff0));
    if ((pTVar11->tt == 3) && (pTVar9->tt == 3)) {
      local_48 = (pTVar11->value).n;
      local_50 = (pTVar9->value).n;
      pcStack_80 = (code *)0x1172f4;
      dVar25 = floor(local_48 / local_50);
      lVar26 = local_48 - dVar25 * local_50;
      L = (lua_State *)local_68;
LAB_00117f54:
      pVVar20->n = lVar26;
      pVVar20[1].b = 3;
      pGVar24 = local_78;
      goto LAB_0011708d;
    }
    ((Proto *)L)->locvars = (LocVar *)local_78;
    op = TM_MOD;
    break;
  case 0x11:
    pTVar11 = (TValue *)((long)&level->value + (ulong)(uVar23 >> 0x13 & 0xfffffff0));
    if ((int)uVar23 < 0) {
      pTVar11 = (TValue *)((long)&local_70->value + (ulong)(uVar23 >> 0x13 & 0xff0));
    }
    pTVar12 = local_70;
    if ((uVar23 >> 0x16 & 1) == 0) {
      pTVar12 = level;
    }
    pTVar9 = (TValue *)((long)&pTVar12->value + (ulong)(uVar23 >> 10 & 0xff0));
    if ((pTVar11->tt == 3) && (pTVar9->tt == 3)) {
      pcStack_80 = (code *)0x11776e;
      lVar26 = pow((pTVar11->value).n,(pTVar9->value).n);
      L = (lua_State *)local_68;
      goto LAB_00117968;
    }
    ((Proto *)L)->locvars = (LocVar *)local_78;
    op = TM_POW;
    break;
  case 0x12:
    uVar15 = (ulong)(uVar23 >> 0x13 & 0xfffffff0);
    pTVar9 = (TValue *)((long)&level->value + uVar15);
    if (*(int *)((long)&level->tt + uVar15) == 3) {
      pVVar20->gc = (GCObject *)((ulong)(pTVar9->value).gc ^ 0x8000000000000000);
      pVVar20[1].b = 3;
      goto LAB_0011708d;
    }
    ((Proto *)L)->locvars = (LocVar *)local_78;
    op = TM_UNM;
    pTVar11 = pTVar9;
    break;
  case 0x13:
    uVar15 = (ulong)(uVar23 >> 0x13 & 0xfffffff0);
    iVar18 = *(int *)((long)&level->tt + uVar15);
    if (iVar18 == 0) {
      uVar23 = 1;
    }
    else if (iVar18 == 1) {
      uVar23 = (uint)(*(int *)((long)&level->value + uVar15) == 0);
    }
    else {
      uVar23 = 0;
    }
    *(uint *)pVVar20 = uVar23;
    pVVar20[1].b = 1;
    goto LAB_0011708d;
  case 0x14:
    uVar15 = (ulong)(uVar23 >> 0x13 & 0xfffffff0);
    pTVar9 = (TValue *)((long)&level->value + uVar15);
    iVar18 = *(int *)((long)&level->tt + uVar15);
    if (iVar18 == 4) {
      uVar2 = *(undefined8 *)((long)(pTVar9->value).gc + 0x10);
      lVar26 = ((double)CONCAT44(0x45300000,(int)((ulong)uVar2 >> 0x20)) - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0);
      goto LAB_00117f54;
    }
    if (iVar18 == 5) {
      pcStack_80 = (code *)0x117865;
      iVar18 = luaH_getn(&((pTVar9->value).gc)->h);
      lVar26 = (lua_Number)iVar18;
      L = (lua_State *)local_68;
      goto LAB_00117968;
    }
    ((Proto *)L)->locvars = (LocVar *)local_78;
    pcStack_80 = (code *)0x117f87;
    iVar18 = call_binTM(L,pTVar9,&luaO_nilobject_,(StkId)pVVar20,TM_LEN);
    if (iVar18 == 0) {
      pcStack_80 = (code *)0x117fa1;
      luaG_typeerror(L,pTVar9,"get length of");
    }
    goto LAB_00117c23;
  case 0x15:
    uVar22 = uVar23 >> 0xe & 0x1ff;
    ((Proto *)L)->locvars = (LocVar *)local_78;
    pcStack_80 = (code *)0x1178d4;
    luaV_concat(L,(uVar22 - (uVar23 >> 0x17)) + 1,uVar22);
    if (L->l_G->GCthreshold <= L->l_G->totalbytes) {
      pcStack_80 = (code *)0x1178ea;
      luaC_step(L);
    }
    level = L->base;
    unaff_R14 = (GCObject *)(ulong)((uVar23 >> 0x17) << 4);
    *(undefined8 *)((long)&level->value + (ulong)(uVar16 << 4)) =
         *(undefined8 *)((long)&(unaff_R14->gch).next + (long)&level->value);
    *(undefined4 *)((long)&level->tt + (ulong)(uVar16 << 4)) =
         *(undefined4 *)((long)&level->tt + (long)unaff_R14);
    pGVar24 = local_78;
    goto LAB_0011708d;
  case 0x16:
    goto switchD_001171a4_caseD_16;
  case 0x17:
    pTVar9 = (TValue *)((long)&level->value + (ulong)(uVar23 >> 0x13 & 0xfffffff0));
    if ((int)uVar23 < 0) {
      pTVar9 = (TValue *)((long)&local_70->value + (ulong)(uVar23 >> 0x13 & 0xff0));
    }
    if ((uVar23 >> 0x16 & 1) != 0) {
      level = local_70;
    }
    uVar15 = (ulong)(uVar23 >> 10 & 0xff0);
    ((Proto *)L)->locvars = (LocVar *)local_78;
    uVar23 = 0;
    if (pTVar9->tt == *(int *)((long)&level->tt + uVar15)) {
      pcStack_80 = (code *)0x117b96;
      uVar23 = luaV_equalval(L,pTVar9,(TValue *)((long)&level->value + uVar15));
    }
    goto LAB_00118098;
  case 0x18:
    pTVar9 = (TValue *)((long)&level->value + (ulong)(uVar23 >> 0x13 & 0xfffffff0));
    if ((int)uVar23 < 0) {
      pTVar9 = (TValue *)((long)&local_70->value + (ulong)(uVar23 >> 0x13 & 0xff0));
    }
    if ((uVar23 >> 0x16 & 1) != 0) {
      level = local_70;
    }
    ((Proto *)L)->locvars = (LocVar *)local_78;
    pcStack_80 = (code *)0x117542;
    uVar23 = luaV_lessthan(L,pTVar9,(TValue *)((long)&level->value + (ulong)(uVar23 >> 10 & 0xff0)))
    ;
    local_78 = pGVar24;
    if (uVar23 == uVar16) {
      local_78 = (GCObject *)
                 ((long)pGVar24 + (ulong)(*(uint *)&(pGVar24->gch).next >> 0xe) * 4 + -0x7fffc);
    }
    goto LAB_001180ad;
  case 0x19:
    ((Proto *)L)->locvars = (LocVar *)local_78;
    pTVar9 = (TValue *)((long)&level->value + (ulong)(uVar23 >> 0x13 & 0xfffffff0));
    if ((int)uVar23 < 0) {
      pTVar9 = (TValue *)((long)&local_70->value + (ulong)(uVar23 >> 0x13 & 0xff0));
    }
    if ((uVar23 >> 0x16 & 1) != 0) {
      level = local_70;
    }
    uVar15 = (ulong)(uVar23 >> 10 & 0xff0);
    pTVar11 = (TValue *)((long)&level->value + uVar15);
    iVar18 = pTVar9->tt;
    if (iVar18 == *(int *)((long)&level->tt + uVar15)) {
      if (iVar18 == 4) {
        pcStack_80 = (code *)0x118038;
        iVar18 = l_strcmp(&((pTVar9->value).gc)->ts,&((pTVar11->value).gc)->ts);
        uVar23 = (uint)(iVar18 < 1);
      }
      else if (iVar18 == 3) {
        uVar23 = (uint)((pTVar9->value).n <= (pTVar11->value).n);
      }
      else {
        pcStack_80 = (code *)0x11805a;
        uVar23 = call_orderTM(L,pTVar9,pTVar11,TM_LE);
        if (uVar23 == 0xffffffff) {
          pcStack_80 = (code *)0x118076;
          iVar18 = call_orderTM(L,pTVar11,pTVar9,TM_LT);
          if (iVar18 == -1) goto LAB_00118086;
          uVar23 = (uint)(iVar18 == 0);
        }
      }
    }
    else {
LAB_00118086:
      pcStack_80 = (code *)0x118094;
      uVar23 = luaG_ordererror(L,pTVar9,pTVar11);
    }
LAB_00118098:
    pGVar24 = unaff_R14;
    if (uVar23 == uVar16) {
      local_78 = (GCObject *)
                 ((long)local_78 + (ulong)(*(uint *)&(local_78->gch).next >> 0xe) * 4 + -0x7fffc);
    }
LAB_001180ad:
    level = L->base;
    unaff_R14 = pGVar24;
    goto LAB_001180b1;
  case 0x1a:
    if (pVVar20[1].b == 0) {
      uVar16 = 1;
    }
    else if (pVVar20[1].b == 1) {
      uVar16 = (uint)(pVVar20->b == 0);
    }
    else {
      uVar16 = 0;
    }
    local_78 = pGVar24;
    if (uVar16 != (uVar23 >> 0xe & 0x1ff)) {
LAB_00117fde:
      local_78 = (GCObject *)
                 ((long)local_78 + (ulong)(*(uint *)&(local_78->gch).next >> 0xe) * 4 + -0x7fffc);
    }
    goto LAB_001180b1;
  case 0x1b:
    uVar15 = (ulong)(uVar23 >> 0x13 & 0xfffffff0);
    pVVar10 = (Value *)((long)&level->value + uVar15);
    iVar18 = *(int *)((long)&level->tt + uVar15);
    if (iVar18 == 0) {
      uVar16 = 1;
    }
    else {
      uVar16 = 0;
      if (iVar18 == 1) {
        uVar16 = (uint)(pVVar10->b == 0);
      }
    }
    local_78 = pGVar24;
    if (uVar16 != (uVar23 >> 0xe & 0x1ff)) {
      *pVVar20 = *pVVar10;
      pVVar20[1].b = iVar18;
      goto LAB_00117fde;
    }
    goto LAB_001180b1;
  case 0x1c:
    if (0x7fffff < uVar23) {
      ((Table *)L)->metatable = (Table *)((long)pVVar20 + (ulong)(uVar23 >> 0x13 & 0xfffffff0));
    }
    uVar23 = uVar23 >> 0xe & 0x1ff;
    ((Proto *)L)->locvars = (LocVar *)local_78;
    pcStack_80 = (code *)0x117bd2;
    iVar18 = luaD_precall(L,(StkId)pVVar20,uVar23 - 1);
    if (iVar18 == 1) {
      if (uVar23 != 0) {
        ((Table *)L)->metatable = (((GCObject *)L->ci)->h).metatable;
      }
      goto LAB_00117c23;
    }
    if (iVar18 != 0) {
      return;
    }
    local_54 = local_54 + 1;
    goto LAB_00117068;
  case 0x1d:
    if (0x7fffff < uVar23) {
      ((Table *)L)->metatable = (Table *)((long)pVVar20 + (ulong)(uVar23 >> 0x13 & 0xfffffff0));
    }
    ((Proto *)L)->locvars = (LocVar *)local_78;
    pcStack_80 = (code *)0x117c1a;
    iVar18 = luaD_precall(L,(StkId)pVVar20,-1);
    if (iVar18 == 1) {
LAB_00117c23:
      level = L->base;
      pGVar24 = local_78;
      goto LAB_0011708d;
    }
    if (iVar18 != 0) {
      return;
    }
    unaff_R14 = (GCObject *)L->ci;
    pGVar24 = unaff_R14[-1].th.openupval;
    pTVar21 = *(Table **)&(unaff_R14->gch).tt;
    pGVar7 = pGVar24;
    if (L->openupval != (GCObject *)0x0) {
      pcStack_80 = (code *)0x118147;
      luaF_close(L,*(StkId *)&unaff_R14[-1].th.env.tt);
      pGVar7 = unaff_R14[-1].th.openupval;
    }
    pTVar9 = (TValue *)(((long)(unaff_R14->gch).next - (long)pTVar21) + (long)pGVar7);
    *(TValue **)&unaff_R14[-1].th.env.tt = pTVar9;
    ((Table *)L)->array = pTVar9;
    if (pTVar21 < ((Table *)L)->metatable) {
      plVar14 = &(pGVar24->gch).tt;
      lVar13 = 0;
      do {
        ((GCheader *)(plVar14 + -8))->next = pTVar21->next;
        *(undefined4 *)plVar14 = *(undefined4 *)&pTVar21->tt;
        lVar13 = lVar13 + 1;
        pTVar21 = (Table *)&pTVar21->metatable;
        plVar14 = plVar14 + 0x10;
      } while (pTVar21 < ((Table *)L)->metatable);
    }
    else {
      lVar13 = 0;
    }
    pGVar24 = (GCObject *)((long)pGVar24 + lVar13 * 0x10);
    ((Table *)L)->metatable = (Table *)pGVar24;
    unaff_R14[-1].th.gclist = pGVar24;
    unaff_R14[-1].th.errorJmp = (lua_longjmp *)((Table *)L)->gclist;
    piVar1 = (int *)((long)&unaff_R14[-1].th.errfunc + 4);
    *piVar1 = *piVar1 + 1;
    ((Table *)L)->lastfree = (Node *)(&((GCObject *)((Table *)L)->lastfree)->u + -1);
    goto LAB_00117068;
  case 0x1e:
    goto switchD_001171a4_caseD_1e;
  case 0x1f:
    dVar25 = pVVar20->n + pVVar20[4].n;
    if (pVVar20[4].n <= 0.0) {
      if (dVar25 < pVVar20[2].n) goto LAB_0011708d;
    }
    else if (pVVar20[2].n < dVar25) goto LAB_0011708d;
    pVVar20->n = dVar25;
    pVVar20[1].b = 3;
    pVVar20[6].n = dVar25;
    pVVar20[7].b = 3;
    pGVar24 = (GCObject *)((long)local_78 + (ulong)(uVar23 >> 0xe) * 4 + -0x7fffc);
    goto LAB_0011708d;
  case 0x20:
    pVVar10 = pVVar20 + 4;
    ((Proto *)L)->locvars = (LocVar *)local_78;
    if (pVVar20[1].b == 3) {
LAB_00117ad3:
      if (pVVar20[3].b != 3) {
        pcStack_80 = (code *)0x117aeb;
        pTVar9 = luaV_tonumber((TValue *)(pVVar20 + 2),(TValue *)(pVVar20 + 2));
        if (pTVar9 == (TValue *)0x0) {
          pcVar19 = "\'for\' limit must be a number";
          goto LAB_001180c1;
        }
      }
      L = (lua_State *)local_68;
      if (pVVar20[5].b != 3) {
        pcStack_80 = (code *)0x118002;
        pVVar10 = &luaV_tonumber((TValue *)pVVar10,(TValue *)pVVar10)->value;
        pGStack_a8 = local_68;
        L = (lua_State *)local_68;
        if (pVVar10 == (Value *)0x0) {
          pcVar19 = "\'for\' step must be a number";
          pcStack_80 = Arith;
          pGVar24 = local_68;
          pGVar7 = local_78;
          luaG_runerror(&local_68->th,"\'for\' step must be a number");
          pVStack_a0 = pVVar20;
          pVStack_98 = pVVar10;
          pGStack_90 = unaff_R14;
          uStack_88 = (ulong)uVar23;
          pcStack_80 = (code *)(ulong)uVar16;
          pTVar9 = luaV_tonumber(obj_00,&TStack_b8);
          if ((pTVar9 != (TValue *)0x0) &&
             (pTVar11 = luaV_tonumber((TValue *)obj,&TStack_c8), pTVar11 != (TValue *)0x0)) {
            (*(code *)(&DAT_0011f224 + *(int *)(&DAT_0011f224 + (ulong)((TMS)pGVar7 - TM_ADD) * 4)))
                      ((pTVar9->value).gc,(pTVar11->value).gc);
            return;
          }
          iVar18 = call_binTM(&pGVar24->th,obj_00,(TValue *)obj,(StkId)pcVar19,(TMS)pGVar7);
          if (iVar18 == 0) {
            luaG_aritherror(&pGVar24->th,obj_00,(TValue *)obj);
          }
          return;
        }
      }
    }
    else {
      pcStack_80 = (code *)0x117ac3;
      pTVar9 = luaV_tonumber((TValue *)pVVar20,(TValue *)pVVar20);
      if (pTVar9 != (TValue *)0x0) goto LAB_00117ad3;
      pcVar19 = "\'for\' initial value must be a number";
LAB_001180c1:
      unaff_R14 = local_68;
      pcStack_80 = (code *)0x1180d0;
      luaG_runerror(&local_68->th,pcVar19);
      L = (lua_State *)unaff_R14;
    }
    pVVar20->n = pVVar20->n - pVVar10->n;
    pVVar20[1].b = 3;
switchD_001171a4_caseD_16:
    pGVar24 = (GCObject *)((long)local_78 + (ulong)(uVar23 >> 0xe) * 4 + -0x7fffc);
    goto LAB_0011708d;
  case 0x21:
    pVVar20[10] = pVVar20[4];
    pVVar20[0xb].b = pVVar20[5].b;
    pVVar20[8] = pVVar20[2];
    pVVar20[9].b = pVVar20[3].b;
    pVVar20[6] = *pVVar20;
    pVVar20[7].b = pVVar20[1].b;
    ((Proto *)L)->k = (TValue *)(pVVar20 + 0xc);
    ((Proto *)L)->locvars = (LocVar *)local_78;
    pcStack_80 = (code *)0x1176ca;
    luaD_call(L,(StkId)(pVVar20 + 6),uVar23 >> 0xe & 0x1ff);
    level = L->base;
    ((Table *)L)->metatable = (((GCObject *)L->ci)->h).metatable;
    uVar15 = (ulong)(uVar16 << 4);
    iVar18 = *(int *)((long)&level[3].tt + uVar15);
    local_78 = pGVar24;
    unaff_R14 = pGVar24;
    if (iVar18 != 0) {
      *(undefined8 *)((long)&level[2].value + uVar15) =
           *(undefined8 *)((long)&level[3].value + uVar15);
      *(int *)((long)&level[2].tt + uVar15) = iVar18;
      local_78 = (GCObject *)
                 ((long)pGVar24 + (ulong)(*(uint *)&(pGVar24->gch).next >> 0xe) * 4 + -0x7fffc);
    }
LAB_001180b1:
    pGVar24 = (GCObject *)((long)&(local_78->gch).next + 4);
    goto LAB_0011708d;
  case 0x22:
    if (uVar23 < 0x800000) {
      uVar22 = (int)((ulong)((long)((Table *)L)->metatable - (long)pVVar20) >> 4) - 1;
      ((Table *)L)->metatable = (((GCObject *)L->ci)->h).metatable;
    }
    else {
      uVar22 = uVar23 >> 0x17;
    }
    uVar23 = uVar23 >> 0xe & 0x1ff;
    if (uVar23 == 0) {
      uVar23 = *(uint *)((long)&(pGVar7->gch).next + 4);
      pGVar24 = (GCObject *)&(pGVar7->gch).tt;
    }
    if (pVVar20[1].b == 5) {
      pGVar7 = pVVar20->gc;
      uVar23 = uVar23 * 0x32;
      unaff_R14 = (GCObject *)(ulong)uVar23;
      iVar18 = uVar22 + uVar23 + -0x32;
      if ((pGVar7->h).sizearray < iVar18) {
        pcStack_80 = (code *)0x117e29;
        luaH_resizearray(L,&pGVar7->h,iVar18);
        L = (lua_State *)local_68;
      }
      if (0 < (int)uVar22) {
        plVar17 = (long *)((long)&level[uVar22].value + (ulong)(uVar16 << 4));
        unaff_R14 = (GCObject *)(ulong)(uVar23 - 0x32);
        uVar15 = (ulong)uVar22;
        do {
          pcStack_80 = (code *)0x117e6d;
          pTVar9 = luaH_setnum(&local_68->th,&pGVar7->h,(uVar23 - 0x32) + (int)uVar15);
          (pTVar9->value).gc = (GCObject *)*plVar17;
          lVar13 = plVar17[1];
          pTVar9->tt = (int)lVar13;
          if (((3 < (int)lVar13) && ((*(byte *)(*plVar17 + 9) & 3) != 0)) &&
             (((pGVar7->gch).marked & 4) != 0)) {
            pcStack_80 = (code *)0x117e9e;
            luaC_barrierback(&local_68->th,&pGVar7->h);
          }
          plVar17 = plVar17 + -2;
          bVar6 = 1 < (long)uVar15;
          L = (lua_State *)local_68;
          uVar15 = uVar15 - 1;
        } while (bVar6);
      }
    }
    goto LAB_0011708d;
  case 0x23:
    pcStack_80 = (code *)0x117380;
    luaF_close(L,(StkId)pVVar20);
    L = (lua_State *)local_68;
    pGVar24 = local_78;
    goto LAB_0011708d;
  case 0x24:
    unaff_R14 = *(GCObject **)
                 (*(long *)(*(long *)(local_60 + 0x20) + 0x20) + (ulong)(uVar23 >> 0xe) * 8);
    bVar3 = (unaff_R14->p).nups;
    pcStack_80 = (code *)0x1171f1;
    pGVar7 = (GCObject *)luaF_newLclosure(L,(uint)bVar3,*(Table **)(local_60 + 0x18));
    (pGVar7->th).l_G = (global_State *)unaff_R14;
    pGVar24 = local_78;
    if (bVar3 != 0) {
      unaff_R14 = (GCObject *)0x0;
      do {
        uVar23 = *(uint *)((long)&(unaff_R14->gch).next + (long)&(pGVar24->gch).next);
        uVar16 = uVar23 >> 0x17;
        if ((uVar23 & 0x3f) == 4) {
          pUVar8 = *(UpVal **)(lVar13 + (ulong)uVar16 * 8 + 0x28);
        }
        else {
          pcStack_80 = (code *)0x117237;
          pUVar8 = luaF_findupval(&local_68->th,(StkId)((long)&level->value + (ulong)(uVar16 << 4)))
          ;
          pGVar24 = local_78;
        }
        *(UpVal **)((long)pGVar7 + (long)unaff_R14 * 2 + 0x28) = pUVar8;
        unaff_R14 = (GCObject *)((long)&(unaff_R14->gch).next + 4);
      } while ((GCObject *)((ulong)bVar3 * 4) != unaff_R14);
      pGVar24 = (GCObject *)((long)&(unaff_R14->gch).next + (long)&(pGVar24->gch).next);
    }
    L = (lua_State *)local_68;
    pVVar20->gc = pGVar7;
    pVVar20[1].b = 6;
    (local_68->p).locvars = (LocVar *)pGVar24;
    if (((local_68->th).l_G)->GCthreshold <= ((local_68->th).l_G)->totalbytes) {
      pcStack_80 = (code *)0x117ef6;
      luaC_step(&local_68->th);
      unaff_R14 = pGVar24;
    }
    goto LAB_00117dcc;
  case 0x25:
    pGVar7 = (GCObject *)L->ci;
    uVar22 = ~(uint)*(byte *)(*(long *)(local_60 + 0x20) + 0x71) +
             (int)((ulong)((long)(pGVar7->gch).next - *(long *)&(pGVar7->gch).tt) >> 4);
    unaff_R14 = (GCObject *)(long)(int)uVar22;
    if (uVar23 < 0x800000) {
      ((Proto *)L)->locvars = (LocVar *)local_78;
      if ((long)((Proto *)L)->upvalues - (long)((Table *)L)->metatable <= (long)(int)(uVar22 * 0x10)
         ) {
        pcStack_80 = (code *)0x1177da;
        luaD_growstack(L,uVar22);
      }
      level = L->base;
      pVVar20 = (Value *)((long)&level->value + (ulong)(uVar16 << 4));
      ((Proto *)L)->k = (TValue *)(pVVar20 + (long)unaff_R14 * 2);
    }
    else {
      uVar22 = (uVar23 >> 0x17) - 1;
    }
    pGVar24 = local_78;
    if (0 < (int)uVar22) {
      pVVar20 = pVVar20 + 1;
      lVar13 = (long)unaff_R14 * -0x10;
      uVar15 = 0;
      do {
        if ((long)uVar15 < (long)unaff_R14) {
          pGVar5 = (pGVar7->gch).next;
          *(undefined8 *)(&pVVar20->b + -2) = *(undefined8 *)((long)pGVar5 + lVar13);
          pVVar20->b = *(int *)((long)pGVar5 + lVar13 + 8);
        }
        else {
          pVVar20->b = 0;
        }
        uVar15 = uVar15 + 1;
        pVVar20 = (Value *)(&pVVar20->b + 4);
        lVar13 = lVar13 + 0x10;
      } while (uVar22 != uVar15);
    }
    goto LAB_0011708d;
  }
  pcStack_80 = (code *)0x117dc8;
  Arith(L,(StkId)pVVar20,pTVar11,pTVar9,op);
  pGVar24 = local_78;
LAB_00117dcc:
  level = L->base;
  goto LAB_0011708d;
switchD_001171a4_caseD_1e:
  if (0x7fffff < uVar23) {
    ((Table *)L)->metatable =
         (Table *)((long)pVVar20 + ((ulong)(uVar23 >> 0x13 & 0xfffffff0) - 0x10));
  }
  if (L->openupval != (GCObject *)0x0) {
    pcStack_80 = (code *)0x1181c0;
    luaF_close(L,level);
  }
  ((Proto *)L)->locvars = (LocVar *)local_78;
  pcStack_80 = (code *)0x1181d3;
  iVar18 = luaD_poscall(L,(StkId)pVVar20);
  local_54 = local_54 + -1;
  if (local_54 == 0) {
    return;
  }
  if (iVar18 != 0) {
    ((Table *)L)->metatable = (((GCObject *)L->ci)->h).metatable;
  }
  goto LAB_00117068;
}

Assistant:

void luaV_execute (lua_State *L, int nexeccalls) {
  LClosure *cl;
  StkId base;
  TValue *k;
  const Instruction *pc;
 reentry:  /* entry point */
  lua_assert(isLua(L->ci));
  pc = L->savedpc;
  cl = &clvalue(L->ci->func)->l;
  base = L->base;
  k = cl->p->k;
  /* main loop of interpreter */
  for (;;) {
    const Instruction i = *pc++;
    StkId ra;
    if ((L->hookmask & (LUA_MASKLINE | LUA_MASKCOUNT)) &&
        (--L->hookcount == 0 || L->hookmask & LUA_MASKLINE)) {
      traceexec(L, pc);
      if (L->status == LUA_YIELD) {  /* did hook yield? */
        L->savedpc = pc - 1;
        return;
      }
      base = L->base;
    }
    /* warning!! several calls may realloc the stack and invalidate `ra' */
    ra = RA(i);
    lua_assert(base == L->base && L->base == L->ci->base);
    lua_assert(base <= L->top && L->top <= L->stack + L->stacksize);
    lua_assert(L->top == L->ci->top || luaG_checkopenop(i));
    switch (GET_OPCODE(i)) {
      case OP_MOVE: {
        setobjs2s(L, ra, RB(i));
        continue;
      }
      case OP_LOADK: {
        setobj2s(L, ra, KBx(i));
        continue;
      }
      case OP_LOADBOOL: {
        setbvalue(ra, GETARG_B(i));
        if (GETARG_C(i)) pc++;  /* skip next instruction (if C) */
        continue;
      }
      case OP_LOADNIL: {
        TValue *rb = RB(i);
        do {
          setnilvalue(rb--);
        } while (rb >= ra);
        continue;
      }
      case OP_GETUPVAL: {
        int b = GETARG_B(i);
        setobj2s(L, ra, cl->upvals[b]->v);
        continue;
      }
      case OP_GETGLOBAL: {
        TValue g;
        TValue *rb = KBx(i);
        sethvalue(L, &g, cl->env);
        lua_assert(ttisstring(rb));
        Protect(luaV_gettable(L, &g, rb, ra));
        continue;
      }
      case OP_GETTABLE: {
        Protect(luaV_gettable(L, RB(i), RKC(i), ra));
        continue;
      }
      case OP_SETGLOBAL: {
        TValue g;
        sethvalue(L, &g, cl->env);
        lua_assert(ttisstring(KBx(i)));
        Protect(luaV_settable(L, &g, KBx(i), ra));
        continue;
      }
      case OP_SETUPVAL: {
        UpVal *uv = cl->upvals[GETARG_B(i)];
        setobj(L, uv->v, ra);
        luaC_barrier(L, uv, ra);
        continue;
      }
      case OP_SETTABLE: {
        Protect(luaV_settable(L, ra, RKB(i), RKC(i)));
        continue;
      }
      case OP_NEWTABLE: {
        int b = GETARG_B(i);
        int c = GETARG_C(i);
        sethvalue(L, ra, luaH_new(L, luaO_fb2int(b), luaO_fb2int(c)));
        Protect(luaC_checkGC(L));
        continue;
      }
      case OP_SELF: {
        StkId rb = RB(i);
        setobjs2s(L, ra+1, rb);
        Protect(luaV_gettable(L, rb, RKC(i), ra));
        continue;
      }
      case OP_ADD: {
        arith_op(luai_numadd, TM_ADD);
        continue;
      }
      case OP_SUB: {
        arith_op(luai_numsub, TM_SUB);
        continue;
      }
      case OP_MUL: {
        arith_op(luai_nummul, TM_MUL);
        continue;
      }
      case OP_DIV: {
        arith_op(luai_numdiv, TM_DIV);
        continue;
      }
      case OP_MOD: {
        arith_op(luai_nummod, TM_MOD);
        continue;
      }
      case OP_POW: {
        arith_op(luai_numpow, TM_POW);
        continue;
      }
      case OP_UNM: {
        TValue *rb = RB(i);
        if (ttisnumber(rb)) {
          lua_Number nb = nvalue(rb);
          setnvalue(ra, luai_numunm(nb));
        }
        else {
          Protect(Arith(L, ra, rb, rb, TM_UNM));
        }
        continue;
      }
      case OP_NOT: {
        int res = l_isfalse(RB(i));  /* next assignment may change this value */
        setbvalue(ra, res);
        continue;
      }
      case OP_LEN: {
        const TValue *rb = RB(i);
        switch (ttype(rb)) {
          case LUA_TTABLE: {
            setnvalue(ra, cast_num(luaH_getn(hvalue(rb))));
            break;
          }
          case LUA_TSTRING: {
            setnvalue(ra, cast_num(tsvalue(rb)->len));
            break;
          }
          default: {  /* try metamethod */
            Protect(
              if (!call_binTM(L, rb, luaO_nilobject, ra, TM_LEN))
                luaG_typeerror(L, rb, "get length of");
            )
          }
        }
        continue;
      }
      case OP_CONCAT: {
        int b = GETARG_B(i);
        int c = GETARG_C(i);
        Protect(luaV_concat(L, c-b+1, c); luaC_checkGC(L));
        setobjs2s(L, RA(i), base+b);
        continue;
      }
      case OP_JMP: {
        dojump(L, pc, GETARG_sBx(i));
        continue;
      }
      case OP_EQ: {
        TValue *rb = RKB(i);
        TValue *rc = RKC(i);
        Protect(
          if (equalobj(L, rb, rc) == GETARG_A(i))
            dojump(L, pc, GETARG_sBx(*pc));
        )
        pc++;
        continue;
      }
      case OP_LT: {
        Protect(
          if (luaV_lessthan(L, RKB(i), RKC(i)) == GETARG_A(i))
            dojump(L, pc, GETARG_sBx(*pc));
        )
        pc++;
        continue;
      }
      case OP_LE: {
        Protect(
          if (lessequal(L, RKB(i), RKC(i)) == GETARG_A(i))
            dojump(L, pc, GETARG_sBx(*pc));
        )
        pc++;
        continue;
      }
      case OP_TEST: {
        if (l_isfalse(ra) != GETARG_C(i))
          dojump(L, pc, GETARG_sBx(*pc));
        pc++;
        continue;
      }
      case OP_TESTSET: {
        TValue *rb = RB(i);
        if (l_isfalse(rb) != GETARG_C(i)) {
          setobjs2s(L, ra, rb);
          dojump(L, pc, GETARG_sBx(*pc));
        }
        pc++;
        continue;
      }
      case OP_CALL: {
        int b = GETARG_B(i);
        int nresults = GETARG_C(i) - 1;
        if (b != 0) L->top = ra+b;  /* else previous instruction set top */
        L->savedpc = pc;
        switch (luaD_precall(L, ra, nresults)) {
          case PCRLUA: {
            nexeccalls++;
            goto reentry;  /* restart luaV_execute over new Lua function */
          }
          case PCRC: {
            /* it was a C function (`precall' called it); adjust results */
            if (nresults >= 0) L->top = L->ci->top;
            base = L->base;
            continue;
          }
          default: {
            return;  /* yield */
          }
        }
      }
      case OP_TAILCALL: {
        int b = GETARG_B(i);
        if (b != 0) L->top = ra+b;  /* else previous instruction set top */
        L->savedpc = pc;
        lua_assert(GETARG_C(i) - 1 == LUA_MULTRET);
        switch (luaD_precall(L, ra, LUA_MULTRET)) {
          case PCRLUA: {
            /* tail call: put new frame in place of previous one */
            CallInfo *ci = L->ci - 1;  /* previous frame */
            int aux;
            StkId func = ci->func;
            StkId pfunc = (ci+1)->func;  /* previous function index */
            if (L->openupval) luaF_close(L, ci->base);
            L->base = ci->base = ci->func + ((ci+1)->base - pfunc);
            for (aux = 0; pfunc+aux < L->top; aux++)  /* move frame down */
              setobjs2s(L, func+aux, pfunc+aux);
            ci->top = L->top = func+aux;  /* correct top */
            lua_assert(L->top == L->base + clvalue(func)->l.p->maxstacksize);
            ci->savedpc = L->savedpc;
            ci->tailcalls++;  /* one more call lost */
            L->ci--;  /* remove new frame */
            goto reentry;
          }
          case PCRC: {  /* it was a C function (`precall' called it) */
            base = L->base;
            continue;
          }
          default: {
            return;  /* yield */
          }
        }
      }
      case OP_RETURN: {
        int b = GETARG_B(i);
        if (b != 0) L->top = ra+b-1;
        if (L->openupval) luaF_close(L, base);
        L->savedpc = pc;
        b = luaD_poscall(L, ra);
        if (--nexeccalls == 0)  /* was previous function running `here'? */
          return;  /* no: return */
        else {  /* yes: continue its execution */
          if (b) L->top = L->ci->top;
          lua_assert(isLua(L->ci));
          lua_assert(GET_OPCODE(*((L->ci)->savedpc - 1)) == OP_CALL);
          goto reentry;
        }
      }
      case OP_FORLOOP: {
        lua_Number step = nvalue(ra+2);
        lua_Number idx = luai_numadd(nvalue(ra), step); /* increment index */
        lua_Number limit = nvalue(ra+1);
        if (luai_numlt(0, step) ? luai_numle(idx, limit)
                                : luai_numle(limit, idx)) {
          dojump(L, pc, GETARG_sBx(i));  /* jump back */
          setnvalue(ra, idx);  /* update internal index... */
          setnvalue(ra+3, idx);  /* ...and external index */
        }
        continue;
      }
      case OP_FORPREP: {
        const TValue *init = ra;
        const TValue *plimit = ra+1;
        const TValue *pstep = ra+2;
        L->savedpc = pc;  /* next steps may throw errors */
        if (!tonumber(init, ra))
          luaG_runerror(L, LUA_QL("for") " initial value must be a number");
        else if (!tonumber(plimit, ra+1))
          luaG_runerror(L, LUA_QL("for") " limit must be a number");
        else if (!tonumber(pstep, ra+2))
          luaG_runerror(L, LUA_QL("for") " step must be a number");
        setnvalue(ra, luai_numsub(nvalue(ra), nvalue(pstep)));
        dojump(L, pc, GETARG_sBx(i));
        continue;
      }
      case OP_TFORLOOP: {
        StkId cb = ra + 3;  /* call base */
        setobjs2s(L, cb+2, ra+2);
        setobjs2s(L, cb+1, ra+1);
        setobjs2s(L, cb, ra);
        L->top = cb+3;  /* func. + 2 args (state and index) */
        Protect(luaD_call(L, cb, GETARG_C(i)));
        L->top = L->ci->top;
        cb = RA(i) + 3;  /* previous call may change the stack */
        if (!ttisnil(cb)) {  /* continue loop? */
          setobjs2s(L, cb-1, cb);  /* save control variable */
          dojump(L, pc, GETARG_sBx(*pc));  /* jump back */
        }
        pc++;
        continue;
      }
      case OP_SETLIST: {
        int n = GETARG_B(i);
        int c = GETARG_C(i);
        int last;
        Table *h;
        if (n == 0) {
          n = cast_int(L->top - ra) - 1;
          L->top = L->ci->top;
        }
        if (c == 0) c = cast_int(*pc++);
        runtime_check(L, ttistable(ra));
        h = hvalue(ra);
        last = ((c-1)*LFIELDS_PER_FLUSH) + n;
        if (last > h->sizearray)  /* needs more space? */
          luaH_resizearray(L, h, last);  /* pre-alloc it at once */
        for (; n > 0; n--) {
          TValue *val = ra+n;
          setobj2t(L, luaH_setnum(L, h, last--), val);
          luaC_barriert(L, h, val);
        }
        continue;
      }
      case OP_CLOSE: {
        luaF_close(L, ra);
        continue;
      }
      case OP_CLOSURE: {
        Proto *p;
        Closure *ncl;
        int nup, j;
        p = cl->p->p[GETARG_Bx(i)];
        nup = p->nups;
        ncl = luaF_newLclosure(L, nup, cl->env);
        ncl->l.p = p;
        for (j=0; j<nup; j++, pc++) {
          if (GET_OPCODE(*pc) == OP_GETUPVAL)
            ncl->l.upvals[j] = cl->upvals[GETARG_B(*pc)];
          else {
            lua_assert(GET_OPCODE(*pc) == OP_MOVE);
            ncl->l.upvals[j] = luaF_findupval(L, base + GETARG_B(*pc));
          }
        }
        setclvalue(L, ra, ncl);
        Protect(luaC_checkGC(L));
        continue;
      }
      case OP_VARARG: {
        int b = GETARG_B(i) - 1;
        int j;
        CallInfo *ci = L->ci;
        int n = cast_int(ci->base - ci->func) - cl->p->numparams - 1;
        if (b == LUA_MULTRET) {
          Protect(luaD_checkstack(L, n));
          ra = RA(i);  /* previous call may change the stack */
          b = n;
          L->top = ra + n;
        }
        for (j = 0; j < b; j++) {
          if (j < n) {
            setobjs2s(L, ra + j, ci->base - n + j);
          }
          else {
            setnilvalue(ra + j);
          }
        }
        continue;
      }
    }
  }
}